

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_filter_test.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  runtime_error *prVar3;
  undefined4 *puVar4;
  exception *e;
  ostringstream oss_5;
  int x_1;
  copy_filter flt_3;
  ostringstream oss_4;
  int x;
  copy_filter flt_2;
  ostringstream oss_3;
  ostringstream oss_2;
  copy_filter flt_1;
  ostringstream oss_1;
  ostringstream oss;
  copy_filter flt;
  ostringstream ss;
  char *in_stack_ffffffffffffeab8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeac0;
  copy_filter local_e50 [471];
  allocator local_c79;
  string local_c78 [39];
  undefined1 local_c51;
  string local_c50 [32];
  ostringstream local_c30 [376];
  string local_ab8 [39];
  undefined1 local_a91;
  string local_a90 [32];
  ostringstream local_a70 [376];
  string local_8f8 [32];
  copy_filter local_8d8 [471];
  allocator local_701;
  string local_700 [39];
  undefined1 local_6d9;
  string local_6d8 [32];
  ostringstream local_6b8 [376];
  string local_540 [39];
  undefined1 local_519;
  string local_518 [32];
  ostringstream local_4f8 [376];
  string local_380 [32];
  copy_filter local_360 [464];
  long local_190 [49];
  undefined4 local_4;
  
  local_4 = 0;
  poVar2 = std::operator<<((ostream *)&std::cout,"- Normal flow");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::operator<<((ostream *)local_190,"a");
  cppcms::copy_filter::copy_filter(local_360,(ostream *)local_190);
  std::operator<<((ostream *)local_190,"bc");
  cppcms::copy_filter::detach_abi_cxx11_();
  bVar1 = std::operator==(in_stack_ffffffffffffeac0,in_stack_ffffffffffffeab8);
  std::__cxx11::string::~string(local_380);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_4f8);
    poVar2 = std::operator<<((ostream *)local_4f8,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/copy_filter_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x16);
    std::operator<<(poVar2," flt.detach()==\"bc\"");
    local_519 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_518);
    local_519 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::operator<<((ostream *)local_190,"d");
  cppcms::copy_filter::~copy_filter(local_360);
  std::operator<<((ostream *)local_190,"e");
  std::__cxx11::ostringstream::str();
  bVar1 = std::operator==(in_stack_ffffffffffffeac0,in_stack_ffffffffffffeab8);
  std::__cxx11::string::~string(local_540);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_6b8);
    poVar2 = std::operator<<((ostream *)local_6b8,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/copy_filter_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1a);
    std::operator<<(poVar2," ss.str()==\"abcde\"");
    local_6d9 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_6d8);
    local_6d9 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"- With Flush");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ios::clear((long)local_190 + *(long *)(local_190[0] + -0x18),0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_700,"",&local_701);
  std::__cxx11::ostringstream::str((string *)local_190);
  std::__cxx11::string::~string(local_700);
  std::allocator<char>::~allocator((allocator<char> *)&local_701);
  std::operator<<((ostream *)local_190,"a");
  cppcms::copy_filter::copy_filter(local_8d8,(ostream *)local_190);
  std::operator<<((ostream *)local_190,"b");
  std::ostream::operator<<((ostream *)local_190,std::flush<char,std::char_traits<char>>);
  std::operator<<((ostream *)local_190,"c");
  cppcms::copy_filter::detach_abi_cxx11_();
  bVar1 = std::operator==(in_stack_ffffffffffffeac0,in_stack_ffffffffffffeab8);
  std::__cxx11::string::~string(local_8f8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_a70);
    poVar2 = std::operator<<((ostream *)local_a70,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/copy_filter_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x24);
    std::operator<<(poVar2," flt.detach()==\"bc\"");
    local_a91 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_a90);
    local_a91 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::copy_filter::~copy_filter(local_8d8);
  std::operator<<((ostream *)local_190,"d");
  std::__cxx11::ostringstream::str();
  bVar1 = std::operator==(in_stack_ffffffffffffeac0,in_stack_ffffffffffffeab8);
  std::__cxx11::string::~string(local_ab8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_c30);
    poVar2 = std::operator<<((ostream *)local_c30,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/copy_filter_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x27);
    std::operator<<(poVar2," ss.str()==\"abcd\"");
    local_c51 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_c50);
    local_c51 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"- With throw and flush");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ios::clear((long)local_190 + *(long *)(local_190[0] + -0x18),0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c78,"",&local_c79);
  std::__cxx11::ostringstream::str((string *)local_190);
  std::__cxx11::string::~string(local_c78);
  std::allocator<char>::~allocator((allocator<char> *)&local_c79);
  std::operator<<((ostream *)local_190,"a");
  cppcms::copy_filter::copy_filter(local_e50,(ostream *)local_190);
  std::operator<<((ostream *)local_190,"b");
  std::ostream::operator<<((ostream *)local_190,std::flush<char,std::char_traits<char>>);
  puVar4 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar4 = 1;
  __cxa_throw(puVar4,&int::typeinfo,0);
}

Assistant:

int main()
{
	try {
		std::cout << "- Normal flow" << std::endl;
		std::ostringstream ss;
		ss << "a";
		{
			cppcms::copy_filter flt(ss);
			ss << "bc";
			TEST(flt.detach()=="bc");
			ss << "d";
		}
		ss << "e";
		TEST(ss.str()=="abcde");
		std::cout << "- With Flush" << std::endl;
		ss.clear();
		ss.str("");
		ss << "a";
		{
			cppcms::copy_filter flt(ss);
			ss << "b";
			ss << std::flush;
			ss << "c";
			TEST(flt.detach()=="bc");
		}
		ss << "d";
		TEST(ss.str()=="abcd");
		std::cout << "- With throw and flush" << std::endl;
		ss.clear();
		ss.str("");
		ss << "a";
		try {
			cppcms::copy_filter flt(ss);
			ss << "b";
			ss << std::flush;
			throw int(1);
		}
		catch(int x){}
		ss << "c";
		TEST(ss.str()=="abc");
		std::cout << "- With throw and no flush" << std::endl;
		ss.clear();
		ss.str("");
		ss << "a";
		try {
			cppcms::copy_filter flt(ss);
			ss << "b";
			throw int(1);
		}
		catch(int x){}
		ss << "c";
		TEST(ss.str()=="ac");

	}
	catch(std::exception const &e) {
		std::cerr << "Fail:" << e.what() << std::endl;
		return 1;
	}
	std::cout << "Ok" << std::endl;
	return 0;

}